

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void str_append(char *dst,char *src,int dst_size)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  int s;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  int iVar1;
  int local_18;
  
  iVar1 = 0;
  dbg_assert_imp((char *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8,(char *)0x167f83);
  local_18 = str_length((char *)0x167f8d);
  for (; (local_18 < in_EDX &&
         (*(undefined1 *)(in_RDI + local_18) = *(undefined1 *)(in_RSI + iVar1),
         *(char *)(in_RSI + iVar1) != '\0')); iVar1 = iVar1 + 1) {
    local_18 = local_18 + 1;
  }
  *(undefined1 *)(in_RDI + (in_EDX + -1)) = 0;
  return;
}

Assistant:

void str_append(char *dst, const char *src, int dst_size)
{
	int s;
	int i = 0;
	dbg_assert(dst_size > 0, "dst_size invalid");
	s = str_length(dst);
	while(s < dst_size)
	{
		dst[s] = src[i];
		if(!src[i]) /* check for null termination */
			break;
		s++;
		i++;
	}

	dst[dst_size-1] = 0; /* assure null termination */
}